

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void __thiscall
toml::
success<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
::~success(success<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
           *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  detail::region<std::vector<char,_std::allocator<char>_>_>::~region(&(this->value).second);
  pcVar1 = (this->value).first.str._M_dataplus._M_p;
  paVar2 = &(this->value).first.str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~success() = default;